

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

uint64 __thiscall google::protobuf::internal::ArenaImpl::Reset(ArenaImpl *this)

{
  uint64 uVar1;
  
  CleanupList(this);
  uVar1 = FreeBlocks(this);
  Init(this);
  return uVar1;
}

Assistant:

uint64 ArenaImpl::Reset() {
  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();
  uint64 space_allocated = FreeBlocks();
  Init();

  return space_allocated;
}